

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwl.hpp
# Opt level: O0

bool hwl::space(state *ps)

{
  combinator_list fs;
  undefined7 in_stack_ffffffffffffff08;
  value_type in_stack_ffffffffffffff0f;
  function<bool_(parser::state_&)> *in_stack_ffffffffffffff10;
  combinator *in_stack_ffffffffffffff20;
  ind in_stack_ffffffffffffff28;
  undefined8 **ppuVar1;
  undefined1 **local_d0;
  undefined1 *local_a0 [8];
  undefined8 *local_60;
  undefined8 local_58;
  byte local_1;
  
  parser::literal(in_stack_ffffffffffffff0f);
  parser::literal(in_stack_ffffffffffffff0f);
  local_58 = 2;
  fs._M_len = in_stack_ffffffffffffff28;
  fs._M_array = in_stack_ffffffffffffff20;
  local_60 = local_a0;
  parser::choice(fs);
  parser::memoize(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  local_1 = std::function<bool_(parser::state_&)>::operator()
                      (in_stack_ffffffffffffff10,
                       (state *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x121f7b);
  std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x121f88);
  ppuVar1 = (undefined8 **)local_a0;
  local_d0 = (undefined1 **)&local_60;
  do {
    local_d0 = local_d0 + -4;
    std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x121fae);
  } while ((undefined8 **)local_d0 != ppuVar1);
  return (bool)(local_1 & 1);
}

Assistant:

bool space(parser::state& ps) {
		return parser::memoize(22, 
			parser::choice({
				parser::literal(' '),
				parser::literal('\t')}))(ps);
	}